

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::makeFourierGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          int *anisotropic_weights,int *level_limits)

{
  bool bVar1;
  int size;
  uint local_8c;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> local_40;
  int *local_28;
  int *anisotropic_weights_local;
  TypeDepth type_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  TasmanianSparseGrid *this_local;
  
  size = depth;
  local_28 = anisotropic_weights;
  anisotropic_weights_local._0_4_ = type;
  anisotropic_weights_local._4_4_ = depth;
  type_local = outputs;
  depth_local = dimensions;
  _outputs_local = this;
  bVar1 = OneDimensionalMeta::isTypeCurved(type);
  if (bVar1) {
    local_8c = depth_local << 1;
  }
  else {
    local_8c = depth_local;
  }
  Utils::copyArray<int_const,int>
            (&local_40,(Utils *)anisotropic_weights,(int *)(ulong)local_8c,size);
  Utils::copyArray<int_const,int>
            (&local_58,(Utils *)level_limits,(int *)(ulong)(uint)depth_local,size);
  makeFourierGrid(this,dimensions,outputs,depth,type,&local_40,&local_58);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_58);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  return;
}

Assistant:

void TasmanianSparseGrid::makeFourierGrid(int dimensions, int outputs, int depth, TypeDepth type, const int* anisotropic_weights, const int* level_limits){
    makeFourierGrid(dimensions, outputs, depth, type, Utils::copyArray(anisotropic_weights, (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions),
                    Utils::copyArray(level_limits, dimensions));
}